

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompMesh::BuildMultiphysicsSpaceWithMemory
          (TPZMultiphysicsCompMesh *this,TPZVec<int> *active_approx_spaces,
          TPZVec<TPZCompMesh_*> *mesh_vector)

{
  ostream *poVar1;
  TPZCompEl *pTVar2;
  long *plVar3;
  long lVar4;
  long iel;
  TPZManVector<TPZCompMesh_*,_7> local_80;
  
  TPZManVector<int,_5>::TPZManVector((TPZManVector<int,_5> *)&local_80,active_approx_spaces);
  TPZManVector<int,_5>::operator=(&this->m_active_approx_spaces,(TPZManVector<int,_5> *)&local_80);
  TPZManVector<int,_5>::~TPZManVector((TPZManVector<int,_5> *)&local_80);
  TPZManVector<TPZCompMesh_*,_7>::TPZManVector(&local_80,mesh_vector);
  TPZManVector<TPZCompMesh_*,_7>::operator=(&this->m_mesh_vector,&local_80);
  TPZManVector<TPZCompMesh_*,_7>::~TPZManVector(&local_80);
  lVar4 = (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements;
  if (lVar4 == (this->m_active_approx_spaces).super_TPZVec<int>.fNElements) {
    (this->super_TPZCompMesh).fNmeshes = (long)(int)lVar4;
    TPZGeoMesh::ResetReference((this->super_TPZCompMesh).fReference);
    TPZCreateApproximationSpace::SetAllCreateFunctionsMultiphysicElemWithMem
              (&(this->super_TPZCompMesh).fCreate);
    (this->super_TPZCompMesh).fCreate.fCreateWithMemory = true;
    CleanElementsConnects(this);
    TPZCompMesh::AutoBuild(&this->super_TPZCompMesh);
    AddElements(this);
    AddConnects(this);
    LoadSolutionFromMeshes(this);
    lVar4 = (long)(int)(this->super_TPZCompMesh).fElementVec.super_TPZChunkVector<TPZCompEl_*,_10>.
                       fNElements;
    iel = 0;
    if (lVar4 < 1) {
      lVar4 = iel;
    }
    for (; lVar4 != iel; iel = iel + 1) {
      pTVar2 = TPZCompMesh::Element(&this->super_TPZCompMesh,iel);
      if ((pTVar2 != (TPZCompEl *)0x0) &&
         (plVar3 = (long *)__dynamic_cast(pTVar2,&TPZCompEl::typeinfo,
                                          &TPZMultiphysicsElement::typeinfo,0),
         plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 0x168))(plVar3);
      }
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "TPZMultiphysicsCompMesh:: The vector provided should have the same size."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZMultiphysicsCompMesh.cpp"
             ,0x6d);
}

Assistant:

void TPZMultiphysicsCompMesh::BuildMultiphysicsSpaceWithMemory(TPZVec<int> & active_approx_spaces, TPZVec<TPZCompMesh * > & mesh_vector){
    m_active_approx_spaces = active_approx_spaces;
    m_mesh_vector          = mesh_vector;
    if (m_mesh_vector.size() != m_active_approx_spaces.size()) {
        std::cout<< "TPZMultiphysicsCompMesh:: The vector provided should have the same size." << std::endl;
        DebugStop();
    }
    
    int n_approx_spaces = m_mesh_vector.size();
    
    SetNMeshes(n_approx_spaces);
    Reference()->ResetReference();
    SetAllCreateFunctionsMultiphysicElemWithMem();
    ApproxSpace().CreateWithMemory(true);
    // delete all elements and connects in the mesh
    CleanElementsConnects();
    TPZCompMesh::AutoBuild();
    AddElements();
    AddConnects();
    LoadSolutionFromMeshes();
    
    int nel_res = NElements();
    for (long el = 0; el < nel_res; el++) {
        TPZCompEl *cel = Element(el);
        TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
        if (!mfcel) {
            continue;
        }
        mfcel->PrepareIntPtIndices();
    }
    
}